

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O0

string * get_peer_address_abi_cxx11_(fd_t s_)

{
  int iVar1;
  ostream *poVar2;
  int in_ESI;
  string *in_RDI;
  ostringstream buf;
  socklen_t size;
  ucred cred;
  int family;
  string *peer_address;
  string *in_stack_00000318;
  fd_t in_stack_00000320;
  string local_1d0 [32];
  ostringstream local_1b0 [380];
  socklen_t local_34;
  int local_30;
  uint local_2c;
  uint local_28;
  int local_14;
  undefined1 local_d;
  int local_c;
  
  local_d = 0;
  local_c = in_ESI;
  std::__cxx11::string::string((string *)in_RDI);
  local_14 = zmq::get_peer_ip_address(in_stack_00000320,in_stack_00000318);
  if (local_14 == 0) {
    std::__cxx11::string::clear();
  }
  else if (local_14 == 1) {
    local_34 = 0xc;
    iVar1 = getsockopt(local_c,1,0x11,&local_30,&local_34);
    if (iVar1 == 0) {
      std::__cxx11::ostringstream::ostringstream(local_1b0);
      poVar2 = std::operator<<((ostream *)local_1b0,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_2c);
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28);
      poVar2 = std::operator<<(poVar2,":");
      std::ostream::operator<<(poVar2,local_30);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator+=((string *)in_RDI,local_1d0);
      std::__cxx11::string::~string(local_1d0);
      std::__cxx11::ostringstream::~ostringstream(local_1b0);
    }
  }
  return in_RDI;
}

Assistant:

static std::string get_peer_address (zmq::fd_t s_)
{
    std::string peer_address;

    const int family = zmq::get_peer_ip_address (s_, peer_address);
    if (family == 0)
        peer_address.clear ();
#if defined ZMQ_HAVE_SO_PEERCRED
    else if (family == PF_UNIX) {
        struct ucred cred;
        socklen_t size = sizeof (cred);
        if (!getsockopt (s_, SOL_SOCKET, SO_PEERCRED, &cred, &size)) {
            std::ostringstream buf;
            buf << ":" << cred.uid << ":" << cred.gid << ":" << cred.pid;
            peer_address += buf.str ();
        }
    }
#elif defined ZMQ_HAVE_LOCAL_PEERCRED
    else if (family == PF_UNIX) {
        struct xucred cred;
        socklen_t size = sizeof (cred);
        if (!getsockopt (s_, 0, LOCAL_PEERCRED, &cred, &size)
            && cred.cr_version == XUCRED_VERSION) {
            std::ostringstream buf;
            buf << ":" << cred.cr_uid << ":";
            if (cred.cr_ngroups > 0)
                buf << cred.cr_groups[0];
            buf << ":";
            peer_address += buf.str ();
        }
    }
#endif

    return peer_address;
}